

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerBreakpointManager.cxx
# Opt level: O3

vector<long,_std::allocator<long>_> * __thiscall
cmDebugger::cmDebuggerBreakpointManager::GetBreakpoints
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,
          cmDebuggerBreakpointManager *this,string *sourcePath,int64_t line)

{
  iterator __position;
  mapped_type *pmVar1;
  pointer pcVar2;
  pointer pcVar3;
  long lVar4;
  pointer pcVar5;
  long lVar6;
  unique_lock<std::mutex> lock;
  long local_48;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->Mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  pmVar1 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->Breakpoints,sourcePath);
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = (pmVar1->
           super__Vector_base<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pmVar1->
           super__Vector_base<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar3 != pcVar2) {
    do {
      lVar6 = (long)pcVar2 - (long)pcVar3;
      lVar4 = (lVar6 >> 3) * -0x5555555555555555 >> 2;
      if (0 < lVar4) {
        pcVar5 = pcVar3 + lVar4 * 4;
        lVar4 = lVar4 + 1;
        pcVar3 = pcVar3 + 2;
        do {
          if ((pcVar3[-2].IsValid == true) && (pcVar3[-2].Line == line)) {
            pcVar3 = pcVar3 + -2;
            goto LAB_0042a353;
          }
          if ((pcVar3[-1].IsValid == true) && (pcVar3[-1].Line == line)) {
            pcVar3 = pcVar3 + -1;
            goto LAB_0042a353;
          }
          if ((pcVar3->IsValid == true) && (pcVar3->Line == line)) goto LAB_0042a353;
          if ((pcVar3[1].IsValid == true) && (pcVar3[1].Line == line)) {
            pcVar3 = pcVar3 + 1;
            goto LAB_0042a353;
          }
          lVar4 = lVar4 + -1;
          pcVar3 = pcVar3 + 4;
        } while (1 < lVar4);
        lVar6 = (long)pcVar2 - (long)pcVar5;
        pcVar3 = pcVar5;
      }
      lVar4 = (lVar6 >> 3) * -0x5555555555555555;
      if (lVar4 == 1) {
LAB_0042a332:
        if ((pcVar3->IsValid != true) || (pcVar3->Line != line)) break;
      }
      else if (lVar4 == 2) {
LAB_0042a322:
        if ((pcVar3->IsValid != true) || (pcVar3->Line != line)) {
          pcVar3 = pcVar3 + 1;
          goto LAB_0042a332;
        }
      }
      else {
        if (lVar4 != 3) break;
        if ((pcVar3->IsValid != true) || (pcVar3->Line != line)) {
          pcVar3 = pcVar3 + 1;
          goto LAB_0042a322;
        }
      }
LAB_0042a353:
      if (pcVar3 == pcVar2) break;
      local_48 = pcVar3->Id;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (__return_storage_ptr__,__position,&local_48);
        pcVar2 = (pmVar1->
                 super__Vector_base<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = local_48;
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pcVar3 = pcVar3 + 1;
    } while( true );
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int64_t> cmDebuggerBreakpointManager::GetBreakpoints(
  std::string const& sourcePath, int64_t line)
{
  std::unique_lock<std::mutex> lock(Mutex);
  const auto& all = Breakpoints[sourcePath];
  std::vector<int64_t> breakpoints;
  if (all.empty()) {
    return breakpoints;
  }

  auto it = all.begin();

  while ((it = std::find_if(
            it, all.end(), [&](const cmDebuggerSourceBreakpoint& breakpoint) {
              return (breakpoint.GetIsValid() && breakpoint.GetLine() == line);
            })) != all.end()) {
    breakpoints.emplace_back(it->GetId());
    ++it;
  }

  return breakpoints;
}